

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O0

void __thiscall DirectiveLoadMipsElf::writeTempData(DirectiveLoadMipsElf *this,TempData *tempData)

{
  TempData *this_00;
  bool bVar1;
  int64_t iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_58;
  string local_38;
  TempData *local_18;
  TempData *tempData_local;
  DirectiveLoadMipsElf *this_local;
  
  local_18 = tempData;
  tempData_local = (TempData *)this;
  bVar1 = ghc::filesystem::path::empty(&this->outputName);
  this_00 = local_18;
  if (bVar1) {
    iVar2 = FileManager::getVirtualAddress(g_fileManager);
    ghc::filesystem::path::u8string_abi_cxx11_(&local_58,&this->inputName);
    tinyformat::format<std::__cxx11::string>
              (&local_38,(tinyformat *)".loadelf \"%s\"",(char *)&local_58,in_RCX);
    TempData::writeLine(this_00,iVar2,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    iVar2 = FileManager::getVirtualAddress(g_fileManager);
    ghc::filesystem::path::u8string_abi_cxx11_(&local_a8,&this->inputName);
    ghc::filesystem::path::u8string_abi_cxx11_(&local_c8,&this->outputName);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_88,(tinyformat *)".loadelf \"%s\",\"%s\"",(char *)&local_a8,&local_c8,in_R8);
    TempData::writeLine(this_00,iVar2,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return;
}

Assistant:

void DirectiveLoadMipsElf::writeTempData(TempData& tempData) const
{
	if (outputName.empty())
	{
		tempData.writeLine(g_fileManager->getVirtualAddress(),tfm::format(".loadelf \"%s\"",inputName.u8string()));
	} else {
		tempData.writeLine(g_fileManager->getVirtualAddress(),tfm::format(".loadelf \"%s\",\"%s\"",
			inputName.u8string(),outputName.u8string()));
	}
}